

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
::operator()(optimize_functor<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<float> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  double dVar1;
  double dVar2;
  double dVar3;
  context *this_00;
  context *ctx_00;
  undefined1 auVar4 [16];
  void *pvVar5;
  undefined1 auVar6 [12];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  quadratic_cost_type<float> *pqVar11;
  long loop;
  bool bVar12;
  float delta;
  float fVar15;
  float fVar13;
  float fVar14;
  float __y;
  double dVar16;
  undefined1 extraout_var [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar17;
  undefined1 auVar20 [64];
  float theta;
  ulong in_XMM4_Qb;
  float ret;
  compute_order compute;
  solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  slv;
  float local_12c;
  optimize_functor<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
  *local_128;
  quadratic_cost_type<float> local_120;
  long local_100;
  bit_array_impl local_f8;
  compute_order local_e8;
  solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  local_b0;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  pqVar11 = original_costs;
  bit_array_impl::bit_array_impl(&local_f8,variables);
  this_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  local_128 = this;
  normalize_costs<float,baryonyx::itm::quadratic_cost_type<float>>
            (&local_120,(itm *)this_00,(context *)original_costs,(quadratic_cost_type<float> *)ctx,
             (random_engine *)(ulong)(uint)variables,(int)pqVar11);
  dVar16 = (this_00->parameters).kappa_step;
  dVar17 = (this_00->parameters).kappa_max;
  dVar1 = (this_00->parameters).alpha;
  dVar2 = (this_00->parameters).delta;
  theta = (float)(this_00->parameters).theta;
  if (0.0 <= dVar2) {
    delta = (float)dVar2;
  }
  else {
    ctx_00 = local_128->m_ctx;
    local_b0.super_debug_logger<true>.ofs._0_4_ = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    auVar18._0_4_ = quadratic_cost_type<float>::min(&local_120,variables);
    auVar18._4_60_ = extraout_var;
    auVar4 = vfnmadd132ss_fma(auVar18._0_16_,auVar18._0_16_,ZEXT416((uint)theta));
    local_12c = auVar4._0_4_;
    local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar18._0_4_;
    info<float,float,float>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_12c,
               (float *)&local_e8,(float *)&local_b0);
    delta = local_12c;
  }
  local_100 = (long)(this_00->parameters).w;
  dVar2 = (this_00->parameters).pushing_k_factor;
  dVar3 = (this_00->parameters).pushing_objective_amplifier;
  solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::solver_equalities_01coeff
            (&local_b0,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_120,constraints);
  compute_order::compute_order(&local_e8,(this_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    fVar13 = (float)dVar16;
    bVar12 = false;
    fVar14 = (float)dVar17;
    __y = (float)dVar1;
    do {
      local_128->m_call_number = local_128->m_call_number + 1;
      dVar16 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
               ::reinit(best_recorder,ctx,bVar12,(this_00->parameters).kappa_min,
                        (this_00->parameters).kappa_max,(bit_array *)&local_f8);
      compute_order::
      init<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                (&local_e8,&local_b0,(bit_array *)&local_f8);
      iVar10 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        auVar6._8_4_ = 0;
        auVar6._0_8_ = in_XMM4_Qb;
        auVar18 = ZEXT1664(CONCAT124(auVar6 << 0x20,(float)dVar16));
        loop = 0;
        while (loop != (this_00->parameters).limit) {
          fVar15 = auVar18._0_4_;
          iVar7 = compute_order::
                  run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                            (&local_e8,&local_b0,(bit_array *)&local_f8,&ctx->rng,fVar15,delta,theta
                            );
          if (iVar7 == 0) {
            dVar17 = quadratic_cost_type<float>::results
                               (original_costs,(bit_array *)&local_f8,cost_constant);
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_f8,dVar17,loop);
            bVar12 = true;
            goto LAB_001e68a0;
          }
          if (iVar7 <= iVar10) {
            iVar10 = iVar7;
          }
          if (local_100 < loop) {
            auVar19._0_4_ = powf((float)iVar7 / (float)local_b0.m,__y);
            auVar19._4_60_ = extraout_var_00;
            auVar4 = vfmadd231ss_fma(ZEXT416((uint)fVar15),auVar19._0_16_,ZEXT416((uint)fVar13));
            auVar18 = ZEXT1664(auVar4);
          }
          else {
            auVar18 = ZEXT464((uint)fVar15);
          }
          if ((fVar14 < auVar18._0_4_) || (loop = loop + 1, ((stop_task->_M_base)._M_i & 1U) != 0))
          break;
        }
        if (0 < iVar10) goto LAB_001e6842;
        bVar12 = false;
LAB_001e68a0:
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar10 = 0;
          iVar7 = 0;
          do {
            if ((this_00->parameters).pushes_limit <= iVar7) break;
            iVar8 = compute_order::
                    push_and_run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                              (&local_e8,&local_b0,(bit_array *)&local_f8,&ctx->rng,(float)dVar2,
                               delta,theta,(float)dVar3);
            if (iVar8 == 0) {
              dVar17 = quadratic_cost_type<float>::results
                                 (original_costs,(bit_array *)&local_f8,cost_constant);
              best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_f8,dVar17,
                           (long)~((this_00->parameters).pushing_iteration_limit * iVar7));
              bVar12 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              auVar18 = ZEXT464((uint)(float)dVar16);
              iVar8 = 1;
              while (iVar8 + -1 < (this_00->parameters).pushing_iteration_limit) {
                fVar15 = auVar18._0_4_;
                iVar9 = compute_order::
                        run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                                  (&local_e8,&local_b0,(bit_array *)&local_f8,&ctx->rng,fVar15,delta
                                   ,theta);
                if (iVar9 == 0) {
                  dVar17 = quadratic_cost_type<float>::results
                                     (original_costs,(bit_array *)&local_f8,cost_constant);
                  best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_f8,dVar17,
                               (long)((this_00->parameters).pushing_iteration_limit * iVar10 - iVar8
                                     ));
                  bVar12 = true;
                  break;
                }
                if ((double)(iVar8 + -1) <= (this_00->parameters).w) {
                  auVar18 = ZEXT464((uint)fVar15);
                }
                else {
                  auVar20._0_4_ = powf((float)iVar9 / (float)local_b0.m,__y);
                  auVar20._4_60_ = extraout_var_01;
                  auVar4 = vfmadd231ss_fma(ZEXT416((uint)fVar15),auVar20._0_16_,
                                           ZEXT416((uint)fVar13));
                  auVar18 = ZEXT1664(auVar4);
                }
                if ((fVar14 < auVar18._0_4_) ||
                   (iVar8 = iVar8 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar7 = iVar7 + 1;
            iVar10 = iVar10 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
LAB_001e6842:
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_f8,iVar10,(this_00->parameters).limit);
        bVar12 = false;
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_e8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar5 = (void *)CONCAT44(local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::~solver_equalities_01coeff(&local_b0);
  if ((_Head_base<0UL,_int_*,_false>)
      local_120.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (_Head_base<0UL,_int_*,_false>)0x0) {
    operator_delete__((void *)local_120.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_120.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if (local_120.quadratic_elements._M_t.
      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
      .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl
      != (__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
          )0x0) {
    operator_delete__((void *)local_120.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                              ._M_head_impl);
  }
  local_120.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
          )0x0;
  if (local_120.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_120.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_f8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_f8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }